

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O2

void __thiscall re2::Tester::Tester(Tester *this,StringPiece *regexp)

{
  TestInstance *in_RAX;
  TestInstance *this_00;
  long lVar1;
  long lVar2;
  TestInstance *t;
  
  (this->v_).super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->v_).super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->v_).super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->error_ = false;
  t = in_RAX;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 200; lVar2 = lVar2 + 0x28) {
      this_00 = (TestInstance *)operator_new(0x48);
      TestInstance::TestInstance
                (this_00,regexp,(&kinds)[lVar1],*(ParseFlags *)((long)&parse_modes + lVar2));
      this->error_ = (bool)(this->error_ | this_00->error_);
      t = this_00;
      std::vector<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>::push_back
                (&this->v_,&t);
    }
  }
  return;
}

Assistant:

Tester::Tester(const StringPiece& regexp) {
  error_ = false;
  for (int i = 0; i < arraysize(kinds); i++) {
    for (int j = 0; j < arraysize(parse_modes); j++) {
      TestInstance* t = new TestInstance(regexp, kinds[i],
                                         parse_modes[j].parse_flags);
      error_ |= t->error();
      v_.push_back(t);
    }
  }
}